

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O2

bool vkt::pipeline::multisample::checkForError
               (VkImageCreateInfo *imageRSInfo,ConstPixelBufferAccess *dataRS,deUint32 errorCompNdx)

{
  uint uVar1;
  deUint32 z;
  uint uVar2;
  deUint32 y;
  uint z_00;
  deUint32 x;
  uint y_00;
  int local_40 [4];
  
  for (uVar2 = 0; uVar1 = (imageRSInfo->extent).depth, uVar2 < uVar1; uVar2 = uVar2 + 1) {
    for (z_00 = 0; z_00 < (imageRSInfo->extent).height; z_00 = z_00 + 1) {
      y_00 = 0;
      while (y_00 < (imageRSInfo->extent).width) {
        tcu::ConstPixelBufferAccess::getPixelUint
                  ((ConstPixelBufferAccess *)local_40,(int)dataRS,y_00,z_00);
        y_00 = y_00 + 1;
        if (local_40[(int)errorCompNdx] != 0) goto LAB_00510103;
      }
    }
  }
LAB_00510103:
  return uVar2 < uVar1;
}

Assistant:

bool checkForError (const vk::VkImageCreateInfo& imageRSInfo, const tcu::ConstPixelBufferAccess& dataRS, const deUint32 errorCompNdx)
{
	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;  ++x)
	{
		const deUint32 errorComponent = dataRS.getPixelUint(x, y, z)[errorCompNdx];

		if (errorComponent > 0)
			return true;
	}

	return false;
}